

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxnet2ncnn.cpp
# Opt level: O1

vector<float,_std::allocator<float>_> * __thiscall
MXNetNode::attr_af(vector<float,_std::allocator<float>_> *__return_storage_ptr__,MXNetNode *this,
                  char *key)

{
  iterator iVar1;
  bool bVar2;
  int iVar3;
  const_iterator cVar4;
  long lVar5;
  int nconsumed;
  float i;
  int local_54;
  key_type local_50;
  
  std::__cxx11::string::string((string *)&local_50,key,(allocator *)&local_54);
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->attrs)._M_t,&local_50);
  if ((void *)CONCAT44(local_50._M_dataplus._M_p._4_4_,local_50._M_dataplus._M_p._0_4_) !=
      (void *)((long)&local_50 + 0x10U)) {
    operator_delete((void *)CONCAT44(local_50._M_dataplus._M_p._4_4_,local_50._M_dataplus._M_p._0_4_
                                    ));
  }
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((_Rb_tree_header *)cVar4._M_node != &(this->attrs)._M_t._M_impl.super__Rb_tree_header) {
    bVar2 = is_attr_scalar(this,key);
    if (bVar2) {
      local_50._M_dataplus._M_p._0_4_ = attr_f(this,key);
      iVar1._M_current =
           (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  (__return_storage_ptr__,iVar1,(float *)&local_50);
      }
      else {
        *iVar1._M_current = local_50._M_dataplus._M_p._0_4_;
        (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
    }
    else {
      local_50._M_dataplus._M_p._0_4_ = 0.0;
      local_54 = 0;
      iVar3 = __isoc99_sscanf(*(undefined8 *)(cVar4._M_node + 2),"%*[(,]%f%n");
      if (iVar3 == 1) {
        lVar5 = 0;
        do {
          iVar1._M_current =
               (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar1._M_current ==
              (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                      ((vector<float,std::allocator<float>> *)__return_storage_ptr__,iVar1,
                       (float *)&local_50);
          }
          else {
            *iVar1._M_current = local_50._M_dataplus._M_p._0_4_;
            (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar1._M_current + 1;
          }
          local_50._M_dataplus._M_p._0_4_ = 0.0;
          lVar5 = (long)(int)lVar5 + (long)local_54;
          iVar3 = __isoc99_sscanf(lVar5 + *(long *)(cVar4._M_node + 2),"%*[(,]%f%n",&local_50,
                                  &local_54);
        } while (iVar3 == 1);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> MXNetNode::attr_af(const char* key) const
{
    const std::map<std::string, std::string>::const_iterator it = attrs.find(key);
    if (it == attrs.end())
        return std::vector<float>();

    // (0.1,0.2,0.3)
    std::vector<float> list;

    if (is_attr_scalar(key))
    {
        list.push_back(attr_f(key));
        return list;
    }

    float i = 0.f;
    int c = 0;
    int nconsumed = 0;
    int nscan = sscanf(it->second.c_str() + c, "%*[(,]%f%n", &i, &nconsumed);
    while (nscan == 1)
    {
        list.push_back(i);
        //         fprintf(stderr, "%f\n", i);

        i = 0.f;
        c += nconsumed;
        nscan = sscanf(it->second.c_str() + c, "%*[(,]%f%n", &i, &nconsumed);
    }

    return list;
}